

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_controller.cpp
# Opt level: O1

void __thiscall
ConfidentialTransactionController_VerifyInputSignature_TEST_WSH_Test::TestBody
          (ConfidentialTransactionController_VerifyInputSignature_TEST_WSH_Test *this)

{
  pointer *ppuVar1;
  SigHashType sighash_type_00;
  void *pvVar2;
  bool bVar3;
  ScriptBuilder *pSVar4;
  Script *script;
  Amount AVar5;
  undefined4 uVar6;
  WitnessVersion version;
  undefined1 local_1f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  AssertionResult gtest_ar_;
  long local_1c0;
  AssertHelper local_1b8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1b0;
  ByteData signature;
  ConfidentialValue amount;
  Script redeem_script;
  ScriptBuilder sb;
  ByteData sighash;
  Pubkey pubkey;
  Txid txid;
  SigHashType sighash_type;
  Privkey privkey;
  SigHashType local_80;
  SigHashType local_74;
  ConfidentialTransactionController ctxc;
  
  ppuVar1 = &redeem_script.script_data_.data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
  redeem_script._vptr_Script = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&redeem_script,
             "02000000010117c10bbfcd4e89f6c33864ed627aa113f249343f4b2bbe6e86dcc725e0d06cfc010000006a473044022038527c96efaaa29b862c8fe8aa4e96602b03035505ebe1f166dd8b9f3731b7b502207e75d937ca1bb2e2f4208618051eb8aad02ad88a71477d7a6e7ec257f72cb6500121036b70f6598ee5c00ad068c9b86c7a1d5c433767a46db3bc3f9d53417171db1782fdffffff030bc7b2b8da0c30f37b12580e0bd092bfbe16e28494fe30feab1769ab4135d30a7609c8e4c3012d90840dbed48eeebc253399645119c01125488640f415285e6e7663031651fe4267cf54e606a83e4c741a01df124d4eb915ae37ad9d5191661d74310b1976a91479975e7d3775b748cbcd5500804518280a2ebbae88ac0b8f78a97d70ad5799c1ef2ca5f7f553ec30fdc87392eb2b5a9acc42d72f5900250978d7a93a301c65b0759c8e7f4b4424ff2a4c124ee2467b08e266423faa3afef30249a8537d641e728c2192f66433e125041341b36fa3e3cde5578ad1acb9a3944b17a9141cd92b989652fbc4c2a92eb1d56456d0ef17d4158701bdc7073c43d37ace6b66b02268ece4754fe6c39a985a16ccbe6cf05b89014d7201000000000000971800000a0000000000000043010001cd72e3aa85cc53ce42edd91e03a6b4d3cd6b08d2125f019639f0ae6ee29e7f8539232c60e68020ab948d95e5c70da679309e8a511a1a0ef65c7b5e5f4dfb83c7fd4d0b60230000000000000001c39d00a796090bd9872e87a9d5f06b5c73c4fe64104a59c25536f90813b311c90de520f63a57875a2e9b6111f41f5fb7b4a253c76027af35fbcf7ddb9e5688ebefb04948f349e48e2ef4cd73b17f1d5786822222f2a1e5367bd1d39b139283800bfc4b7d50ce927469541151be53b3518b0fa1e9acb8089072976b1d659e8136c666f0b57cec51775ccd40998ee57ace137e25ee7e066d9d434c0e54304913019db87855de47f7f1e974578dfedb95a92048fafe0dca541bd917ea22d9c02fd58fafc8ee35f016b4b1ebf0051a314038201163b3fc6fa09b7ac0bf45474b216f8e152433433193b6e5db6da465ddd5c0e7d23b6a2e153998e0e936539aa3ce4f1ed448157dff1f420c404c019ec5e86ab18a9b859cc3165a7f104f3a7a9abb6835a62834750f110730e7d16de16cbb7f6607fc4ae04de5baec980e3137766c23568f8bb03473d3e043d3a8d8da0a2613bf27d0ce388ed44b8e1a217b2ef5193d19fb6b943c1b8a1bebfb02b9cea87fec0edbe03ee63a3a1168c53456af1fed9fe7707b2fb58159922cb84e1e28a29d26e036c12c91666096d556eefada060c530a28837f37a456847a26fcee92092837c14144ac3e1f3a84763e40cced0d77dcfe76f537825e08d2441d612d5e80eef617ffa6b96e30825d8905bef96dd4da8457f8d43e3f3c029444..." /* TRUNCATED STRING LITERAL */
             ,"");
  cfd::ConfidentialTransactionController::ConfidentialTransactionController
            (&ctxc,(string *)&redeem_script);
  if (redeem_script._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(redeem_script._vptr_Script,
                    (ulong)(redeem_script.script_data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish + 1));
  }
  cfd::core::Privkey::GenerageRandomKey();
  sb._vptr_ScriptBuilder = (_func_int **)&PTR__ScriptBuilder_0087ae78;
  sb.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sb.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sb.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  redeem_script._vptr_Script = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&redeem_script,
             "fc6cd0e025c7dc866ebe2b4b3f3449f213a17a62ed6438c3f6894ecdbf0bc117","");
  cfd::core::Txid::Txid(&txid,(string *)&redeem_script);
  if (redeem_script._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(redeem_script._vptr_Script,
                    (ulong)(redeem_script.script_data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish + 1));
  }
  cfd::core::Privkey::GeneratePubkey(&pubkey,&privkey,true);
  pSVar4 = cfd::core::ScriptBuilder::AppendOperator
                     (&sb,(ScriptOperator *)cfd::core::ScriptOperator::OP_1);
  pSVar4 = cfd::core::ScriptBuilder::AppendData(pSVar4,&pubkey);
  ppuVar1 = &amount.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  amount._vptr_ConfidentialValue = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&amount,"0229ebd1cac7855ca60b0846bd179ff3d411f807f3f3a43abf498e0a415c94d622",
             "");
  cfd::core::Pubkey::Pubkey((Pubkey *)local_1f0,(string *)&amount);
  pSVar4 = cfd::core::ScriptBuilder::AppendData(pSVar4,(Pubkey *)local_1f0);
  pSVar4 = cfd::core::ScriptBuilder::AppendOperator
                     (pSVar4,(ScriptOperator *)cfd::core::ScriptOperator::OP_2);
  pSVar4 = cfd::core::ScriptBuilder::AppendOperator
                     (pSVar4,(ScriptOperator *)cfd::core::ScriptOperator::OP_CHECKMULTISIG);
  cfd::core::ScriptBuilder::Build(&redeem_script,pSVar4);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_1f0._0_8_,local_1e0._M_allocated_capacity - local_1f0._0_8_);
  }
  if (amount._vptr_ConfidentialValue != (_func_int **)ppuVar1) {
    operator_delete(amount._vptr_ConfidentialValue,
                    (ulong)(amount.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish + 1));
  }
  cfd::core::SigHashType::SigHashType(&sighash_type,kSigHashAll,false,false);
  AVar5 = cfd::core::Amount::CreateBySatoshiAmount(1000000000);
  local_1f0._0_8_ = AVar5.amount_;
  local_1f0[8] = AVar5.ignore_check_;
  cfd::core::ConfidentialValue::ConfidentialValue(&amount,(Amount *)local_1f0);
  cfd::core::ByteData::ByteData(&sighash);
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::core::SigHashType::SigHashType(&local_80,&sighash_type);
      cfd::ConfidentialTransactionController::CreateSignatureHash
                ((ByteData *)local_1f0,&ctxc,&txid,1,&redeem_script,&local_80,&amount,kVersion0);
      cfd::core::ByteData::operator=(&sighash,(ByteData *)local_1f0);
      if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete((void *)local_1f0._0_8_,local_1e0._M_allocated_capacity - local_1f0._0_8_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_1f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&signature,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_controller.cpp"
               ,0x130,
               "Expected: sighash = ctxc.CreateSignatureHash(txid, vout, redeem_script, sighash_type, amount, WitnessVersion::kVersion0) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&signature,(Message *)local_1f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&signature);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_1f0._0_8_ + 8))();
      }
      local_1f0._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  cfd::core::ByteData::ByteData(&signature);
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::core::ByteData::GetBytes(&local_1b0,&sighash);
      cfd::core::ByteData256::ByteData256((ByteData256 *)&gtest_ar_,&local_1b0);
      cfd::core::SignatureUtil::CalculateEcSignature
                ((ByteData *)local_1f0,(ByteData256 *)&gtest_ar_,&privkey,true,false);
      cfd::core::ByteData::operator=(&signature,(ByteData *)local_1f0);
      if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete((void *)local_1f0._0_8_,local_1e0._M_allocated_capacity - local_1f0._0_8_);
      }
      pvVar2 = (void *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,local_1c0 - (long)pvVar2);
      }
      if ((long *)local_1b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start != (long *)0x0) {
        operator_delete(local_1b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_1b0.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1b0.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_1f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_controller.cpp"
               ,0x134,
               "Expected: signature = SignatureUtil::CalculateEcSignature( ByteData256(sighash.GetBytes()), privkey) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)local_1f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(size_type *)local_1f0._0_8_ + 8))();
      }
      local_1f0._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  version = 0x1e5816;
  cfd::core::SigHashType::SigHashType(&local_74,&sighash_type);
  script = &redeem_script;
  uVar6 = SUB84(&amount,0);
  sighash_type_00.is_anyone_can_pay_ = (bool)(char)uVar6;
  sighash_type_00.is_fork_id_ = (bool)(char)((uint)uVar6 >> 8);
  sighash_type_00._10_2_ = (short)((uint)uVar6 >> 0x10);
  sighash_type_00._0_8_ = &local_74;
  gtest_ar_.success_ =
       cfd::ConfidentialTransactionController::VerifyInputSignature
                 (&ctxc,&signature,&pubkey,&txid,1,script,sighash_type_00,(ConfidentialValue *)0x0,
                  version);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_1b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1f0,(internal *)&gtest_ar_,
               (AssertionResult *)
               "ctxc.VerifyInputSignature(signature, pubkey, txid, vout, redeem_script, sighash_type, amount, WitnessVersion::kVersion0)"
               ,"false","true",(char *)script);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_controller.cpp"
               ,0x137,(char *)local_1f0._0_8_);
    testing::internal::AssertHelper::operator=(&local_1b8,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_1b8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1e0) {
      operator_delete((void *)local_1f0._0_8_,(ulong)(local_1e0._M_allocated_capacity + 1));
    }
    if ((long *)local_1b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((long *)local_1b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start != (long *)0x0)) {
        (**(code **)(*(long *)local_1b0.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
      local_1b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  if (signature.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(signature.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)signature.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)signature.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (sighash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(sighash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)sighash.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)sighash.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  amount._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_0087cda8;
  if (amount.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(amount.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)amount.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)amount.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  cfd::core::Script::~Script(&redeem_script);
  if (pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(pubkey.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)pubkey.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)pubkey.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  txid._vptr_Txid = (_func_int **)&PTR__Txid_0087c9b8;
  if (txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(txid.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)txid.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)txid.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  sb._vptr_ScriptBuilder = (_func_int **)&PTR__ScriptBuilder_0087ae78;
  if (sb.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(sb.script_byte_array_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)sb.script_byte_array_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)sb.script_byte_array_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (privkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(privkey.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)privkey.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)privkey.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  ctxc.super_AbstractTransactionController._vptr_AbstractTransactionController =
       (_func_int **)&PTR__ConfidentialTransactionController_0087c940;
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction(&ctxc.transaction_);
  return;
}

Assistant:

TEST(ConfidentialTransactionController, AddPegoutTxOut)
{
    ConfidentialTransactionController txc(2, 0);
    Address addr;
    txc.AddTxIn(Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"), 0, 4294967293);
    txc.AddTxOut(
        Address("XBMr6srTXmWuHifFd8gs54xYfiCBsvrksA", cfd::core::GetElementsAddressFormatList()),
        Amount::CreateBySatoshiAmount(209998999992700),
        ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"));
    txc.AddPegoutTxOut(
        Amount::CreateBySatoshiAmount(1000000000),
        ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"),
        BlockHash("0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206"),
        Address("2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo"),
        NetType::kRegtest,
        Pubkey("0214156e4ae9168289b4d0c034da94025121d33ad8643663454885032d77640e3d"),
        Privkey::FromWif("cVPA9nh4bHhKXinBCLkJJTD3UgfiizWRykXfFegwZzKMNYAKG9RL", NetType::kRegtest),
        "sh(wpkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y/0/*))",
        0,
        ByteData("030e07d4f657c0c169e04fac5d5a8096adb099874834be59ad1e681e22d952ccda0214156e4ae9168289b4d0c034da94025121d33ad8643663454885032d77640e3d"),
        NetType::kElementsRegtest,
        &addr);
    txc.AddTxOutFee(
        Amount::CreateBySatoshiAmount(7300),
        ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"));

    EXPECT_STREQ(txc.GetHex().c_str(), "020000000001a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000fdffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c0017a914001d6db698e75a5a8af771730c4ab258af30546b870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000003b9aca00009e6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914a722b257cabc3b8e7d46f8fb293f893f368219da872103700dcb030588ed828d85f645b48971de0d31e8c0244da46710d18681627f5a4a4101044e949dcf8ac2daac82a3e4999ee28e2711661793570c4daab34cd38d76a425d6bfe102f3fea8be12109925fad32c78b65afea4de1d17a826e7375d0e2d00660125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c84000000000000");
    EXPECT_STREQ(addr.GetAddress().c_str(), "2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo");
}